

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O0

int __thiscall FIX::FieldMap::calculateTotal(FieldMap *this,int checkSumField)

{
  bool bVar1;
  int iVar2;
  pointer pFVar3;
  pointer ppVar4;
  reference ppFVar5;
  __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
  local_60;
  FieldMap **local_58;
  __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
  local_50;
  const_iterator k;
  _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
  local_38;
  const_iterator j;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_20;
  const_iterator i;
  int result;
  int checkSumField_local;
  FieldMap *this_local;
  
  i._M_current._0_4_ = 0;
  i._M_current._4_4_ = checkSumField;
  __gnu_cxx::
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  ::__normal_iterator(&local_20);
  local_20._M_current =
       (FieldBase *)
       std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::begin(&this->m_fields);
  while( true ) {
    j._M_node = (_Base_ptr)
                std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::end(&this->m_fields);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
                        *)&j);
    if (!bVar1) break;
    pFVar3 = __gnu_cxx::
             __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
             ::operator->(&local_20);
    iVar2 = FieldBase::getTag(pFVar3);
    if (iVar2 != i._M_current._4_4_) {
      pFVar3 = __gnu_cxx::
               __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
               ::operator->(&local_20);
      iVar2 = FieldBase::getTotal(pFVar3);
      i._M_current._0_4_ = iVar2 + (int)i._M_current;
    }
    __gnu_cxx::
    __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
    ::operator++(&local_20);
  }
  std::
  _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
  ::_Rb_tree_const_iterator(&local_38);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
       ::begin(&this->m_groups);
  while( true ) {
    k._M_current = (FieldMap **)
                   std::
                   map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
                   ::end(&this->m_groups);
    bVar1 = std::operator!=(&local_38,(_Self *)&k);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
    ::__normal_iterator(&local_50);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
             ::operator->(&local_38);
    local_58 = (FieldMap **)
               std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::begin
                         (&ppVar4->second);
    local_50._M_current = local_58;
    while( true ) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
               ::operator->(&local_38);
      local_60._M_current =
           (FieldMap **)
           std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::end(&ppVar4->second);
      bVar1 = __gnu_cxx::operator!=(&local_50,&local_60);
      if (!bVar1) break;
      ppFVar5 = __gnu_cxx::
                __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                ::operator*(&local_50);
      iVar2 = calculateTotal(*ppFVar5,10);
      i._M_current._0_4_ = iVar2 + (int)i._M_current;
      __gnu_cxx::
      __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
      ::operator++(&local_50);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
    ::operator++(&local_38);
  }
  return (int)i._M_current;
}

Assistant:

int FieldMap::calculateTotal( int checkSumField ) const
{
  int result = 0;
  Fields::const_iterator i;
  for ( i = m_fields.begin(); i != m_fields.end(); ++i )
  {
    if ( i->getTag() != checkSumField )
      result += i->getTotal();
  }

  Groups::const_iterator j;
  for ( j = m_groups.begin(); j != m_groups.end(); ++j )
  {
    std::vector < FieldMap* > ::const_iterator k;
    for ( k = j->second.begin(); k != j->second.end(); ++k )
      result += ( *k ) ->calculateTotal();
  }
  return result;
}